

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeResumeTable<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  ParseDeclsCtx *pPVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> expected;
  allocator<char> local_199;
  string local_198;
  Err local_178;
  Err local_150;
  Err *local_130;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> label;
  string_view local_d0;
  uint local_bc;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> tag;
  Ok local_19;
  ParseDeclsCtx *pPStack_18;
  OnClauseListT resumetable;
  ParseDeclsCtx *ctx_local;
  
  pPStack_18 = ctx;
  NullInstrParserCtx::makeOnClauseList((NullInstrParserCtx *)ctx);
  do {
    pPVar1 = pPStack_18;
    expected = sv("on",2);
    bVar2 = Lexer::takeSExprStart(&pPVar1->in,expected);
    if (!bVar2) {
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_19);
      return __return_storage_ptr__;
    }
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    tagidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)__return_storage_ptr___00,pPStack_18)
    ;
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)local_80,(Result<wasm::Ok> *)__return_storage_ptr___00);
    local_98 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_80);
    bVar2 = local_98 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err(&local_b8,local_98);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
      wasm::Err::~Err(&local_b8);
    }
    local_bc = (uint)bVar2;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_80);
    pPVar1 = pPStack_18;
    if (local_bc == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"switch");
      bVar2 = Lexer::takeKeyword(&pPVar1->in,local_d0);
      pPVar1 = pPStack_18;
      if (bVar2) {
        Result<wasm::Ok>::operator*
                  ((Result<wasm::Ok> *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        NullInstrParserCtx::makeOnSwitch((NullInstrParserCtx *)pPVar1);
        NullInstrParserCtx::appendOnClause((NullInstrParserCtx *)pPVar1,&local_19);
      }
      else {
        labelidx<wasm::WATParser::ParseDeclsCtx>
                  ((Result<wasm::Ok> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pPStack_18,false);
        Result<wasm::Ok>::Result
                  ((Result<wasm::Ok> *)&err_1,
                   (Result<wasm::Ok> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        local_130 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
        bVar2 = local_130 != (Err *)0x0;
        if (bVar2) {
          wasm::Err::Err(&local_150,local_130);
          Result<wasm::Ok>::Result(__return_storage_ptr__,&local_150);
          wasm::Err::~Err(&local_150);
        }
        local_bc = (uint)bVar2;
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
        pPVar1 = pPStack_18;
        if (local_bc == 0) {
          Result<wasm::Ok>::operator*
                    ((Result<wasm::Ok> *)
                     ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          Result<wasm::Ok>::operator*
                    ((Result<wasm::Ok> *)
                     ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          NullInstrParserCtx::makeOnLabel((NullInstrParserCtx *)pPVar1);
          NullInstrParserCtx::appendOnClause((NullInstrParserCtx *)pPVar1,&local_19);
          local_bc = 0;
        }
        Result<wasm::Ok>::~Result
                  ((Result<wasm::Ok> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        if (local_bc != 0) goto LAB_0239795a;
      }
      bVar2 = Lexer::takeRParen(&pPStack_18->in);
      pPVar1 = pPStack_18;
      if (bVar2) {
        local_bc = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_198,"expected \')\' at end of handler clause",&local_199);
        Lexer::err(&local_178,&pPVar1->in,&local_198);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_178);
        wasm::Err::~Err(&local_178);
        std::__cxx11::string::~string((string *)&local_198);
        std::allocator<char>::~allocator(&local_199);
        local_bc = 1;
      }
    }
LAB_0239795a:
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    if (local_bc != 0) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Result<typename Ctx::OnClauseListT> makeResumeTable(Ctx& ctx) {
  auto resumetable = ctx.makeOnClauseList();
  while (ctx.in.takeSExprStart("on"sv)) {
    auto tag = tagidx(ctx);
    CHECK_ERR(tag);
    if (ctx.in.takeKeyword("switch")) {
      ctx.appendOnClause(resumetable, ctx.makeOnSwitch(*tag));
    } else {
      auto label = labelidx(ctx);
      CHECK_ERR(label);
      ctx.appendOnClause(resumetable, ctx.makeOnLabel(*tag, *label));
    }
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of handler clause");
    }
  }
  return resumetable;
}